

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

cjpeg_source_ptr jinit_read_ppm(j_compress_ptr cinfo)

{
  cjpeg_source_ptr pcVar1;
  long in_RDI;
  ppm_source_ptr source;
  
  pcVar1 = (cjpeg_source_ptr)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x58);
  pcVar1->start_input = start_input_ppm;
  pcVar1->finish_input = finish_input_ppm;
  return pcVar1;
}

Assistant:

GLOBAL(cjpeg_source_ptr)
jinit_read_ppm(j_compress_ptr cinfo)
{
  ppm_source_ptr source;

  /* Create module interface object */
  source = (ppm_source_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(ppm_source_struct));
  /* Fill in method ptrs, except get_pixel_rows which start_input sets */
  source->pub.start_input = start_input_ppm;
  source->pub.finish_input = finish_input_ppm;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  source->pub.max_pixels = 0;
#endif

  return (cjpeg_source_ptr)source;
}